

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O0

void __thiscall
RegisterCLParserTestParseFilenameFilter::RegisterCLParserTestParseFilenameFilter
          (RegisterCLParserTestParseFilenameFilter *this)

{
  RegisterCLParserTestParseFilenameFilter *this_local;
  
  RegisterTest(CLParserTestParseFilenameFilter::Create,"CLParserTest.ParseFilenameFilter");
  return;
}

Assistant:

TEST(CLParserTest, ParseFilenameFilter) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo.cc\r\n"
      "cl: warning\r\n",
      "", &output, &err));
  ASSERT_EQ("cl: warning\n", output);
}